

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int client_hello_decode_key_share
              (ptls_key_exchange_algorithm_t **selected_group,ptls_iovec_t *selected_key,
              ptls_key_exchange_algorithm_t **candidates,uint8_t *src,uint8_t *end)

{
  ptls_key_exchange_algorithm_t *ppVar1;
  ptls_key_exchange_algorithm_t **pppVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  uint8_t *end_00;
  bool bVar7;
  uint16_t group;
  ptls_iovec_t key;
  uint16_t local_6a;
  uint8_t *local_68;
  ptls_key_exchange_algorithm_t **local_60;
  ptls_iovec_t *local_58;
  ptls_key_exchange_algorithm_t **local_50;
  ptls_key_exchange_algorithm_t **local_48;
  ptls_iovec_t local_40;
  
  if ((ulong)((long)end - (long)src) < 2) {
    bVar7 = false;
    iVar3 = 0x32;
    local_68 = src;
  }
  else {
    lVar4 = 0;
    uVar6 = 0;
    do {
      uVar6 = (ulong)src[lVar4] | uVar6 << 8;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 2);
    local_68 = src + 2;
    bVar7 = false;
    iVar3 = 0x32;
    if (uVar6 <= (ulong)((long)end - (long)local_68)) {
      end_00 = local_68 + uVar6;
      if (local_68 == end_00) {
        bVar7 = true;
        iVar3 = 0;
      }
      else {
        local_50 = candidates + 1;
        local_60 = selected_group;
        local_58 = selected_key;
        local_48 = candidates;
        do {
          iVar3 = decode_key_share_entry(&local_6a,&local_40,&local_68,end_00);
          iVar5 = 6;
          if (iVar3 == 0) {
            iVar5 = 0;
            if (*local_60 == (ptls_key_exchange_algorithm_t *)0x0) {
              ppVar1 = *local_48;
              pppVar2 = local_50;
              while (iVar5 = 0, ppVar1 != (ptls_key_exchange_algorithm_t *)0x0) {
                if (ppVar1->id == local_6a) {
                  *local_60 = ppVar1;
                  local_58->base = local_40.base;
                  local_58->len = local_40.len;
                  iVar5 = 0;
                  break;
                }
                ppVar1 = *pppVar2;
                pppVar2 = pppVar2 + 1;
              }
            }
          }
          if (iVar3 != 0) goto LAB_00112802;
        } while (local_68 != end_00);
        iVar5 = 0;
LAB_00112802:
        bVar7 = iVar5 == 0;
      }
    }
  }
  iVar5 = 0x32;
  if (local_68 == end) {
    iVar5 = iVar3;
  }
  if (!bVar7) {
    iVar5 = iVar3;
  }
  return iVar5;
}

Assistant:

static int client_hello_decode_key_share(ptls_key_exchange_algorithm_t **selected_group, ptls_iovec_t *selected_key,
                                         ptls_key_exchange_algorithm_t **candidates, const uint8_t *src, const uint8_t *end)
{
    int ret = 0;

    decode_block(src, end, 2, {
        while (src != end) {
            uint16_t group;
            ptls_iovec_t key;
            if ((ret = decode_key_share_entry(&group, &key, &src, end)) != 0)
                goto Exit;
            if (*selected_group == NULL) {
                ptls_key_exchange_algorithm_t **c = candidates;
                for (; *c != NULL; ++c) {
                    if ((*c)->id == group) {
                        *selected_group = *c;
                        *selected_key = key;
                        break;
                    }
                }
            }
        }
    });

Exit:
    return ret;
}